

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QString * qt_setWindowTitle_helperHelper
                    (QString *__return_storage_ptr__,QString *title,QWidget *widget)

{
  Data *pDVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QStyle *pQVar6;
  CaseSensitivity CVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  long in_FS_OFFSET;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  pDVar1 = (title->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (title->d).ptr;
  (__return_storage_ptr__->d).size = (title->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((__return_storage_ptr__->d).size != 0) {
    QVar11.m_data = (char *)0x3;
    QVar11.m_size = (qsizetype)__return_storage_ptr__;
    uVar2 = QString::indexOf(QVar11,0x6747ec,CaseInsensitive);
    while (uVar2 != 0xffffffff) {
      lVar9 = (ulong)uVar2 << 0x20;
      lVar8 = lVar9 + -0x100000000;
      bVar10 = false;
      do {
        lVar9 = lVar9 + 0x300000000;
        QVar12.m_data = (char *)0x3;
        QVar12.m_size = (qsizetype)__return_storage_ptr__;
        CVar7 = (CaseSensitivity)((ulong)lVar9 >> 0x20);
        lVar5 = QString::indexOf(QVar12,0x6747ec,CVar7);
        bVar10 = (bool)(bVar10 ^ 1);
        lVar8 = lVar8 + 0x300000000;
      } while (lVar5 == lVar9 >> 0x20);
      if (bVar10) {
        QVar13.m_data = (char *)0x3;
        QVar13.m_size = (qsizetype)__return_storage_ptr__;
        iVar3 = QString::lastIndexOf(QVar13,0x6747ec,(CaseSensitivity)((ulong)lVar8 >> 0x20));
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x241) & 2) != 0) {
          pQVar6 = QWidget::style(widget);
          iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x30,0,widget,0);
          if (iVar4 != 0) {
            QMetaObject::tr((char *)local_50,(char *)&QWidget::staticMetaObject,0x678106);
            QString::replace((longlong)__return_storage_ptr__,(long)iVar3,(QString *)0x3);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,0x10);
              }
            }
            goto LAB_003051e4;
          }
        }
        QString::remove((longlong)__return_storage_ptr__,(long)iVar3);
      }
LAB_003051e4:
      QVar14.m_data = (char *)0x3;
      QVar14.m_size = (qsizetype)__return_storage_ptr__;
      uVar2 = QString::indexOf(QVar14,0x6747ec,CVar7);
    }
    QVar15.m_data = (char *)0x6;
    QVar15.m_size = (qsizetype)__return_storage_ptr__;
    QVar16.m_data = (char *)0x3;
    QVar16.m_size = (qsizetype)"[*][*]";
    QString::replace(QVar15,QVar16,0x6747ec);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString qt_setWindowTitle_helperHelper(const QString &title, const QWidget *widget)
{
    Q_ASSERT(widget);

    QString cap = title;
    if (cap.isEmpty())
        return cap;

    const auto placeHolder = "[*]"_L1;
    int index = cap.indexOf(placeHolder);

    // here the magic begins
    while (index != -1) {
        index += placeHolder.size();
        int count = 1;
        while (cap.indexOf(placeHolder, index) == index) {
            ++count;
            index += placeHolder.size();
        }

        if (count%2) { // odd number of [*] -> replace last one
            int lastIndex = cap.lastIndexOf(placeHolder, index - 1);
            if (widget->isWindowModified()
             && widget->style()->styleHint(QStyle::SH_TitleBar_ModifyNotification, nullptr, widget))
                cap.replace(lastIndex, 3, QWidget::tr("*"));
            else
                cap.remove(lastIndex, 3);
        }

        index = cap.indexOf(placeHolder, index);
    }

    cap.replace("[*][*]"_L1, placeHolder);

    return cap;
}